

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int cd_product_variable_set_init_expression(parser_info *info)

{
  int iVar1;
  parser_info *info_local;
  
  iVar1 = coda_product_variable_set_init_expression
                    ((coda_product_variable *)info->node->parent->data,
                     (coda_expression *)info->node->data);
  if (iVar1 == 0) {
    info->node->data = (void *)0x0;
    info_local._4_4_ = 0;
  }
  else {
    info_local._4_4_ = -1;
  }
  return info_local._4_4_;
}

Assistant:

static int cd_product_variable_set_init_expression(parser_info *info)
{
    if (coda_product_variable_set_init_expression((coda_product_variable *)info->node->parent->data,
                                                  (coda_expression *)info->node->data) != 0)
    {
        return -1;
    }
    info->node->data = NULL;
    return 0;
}